

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginGroup(void)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiGroupData *__dest;
  int iVar6;
  int iVar7;
  ImGuiContext *ctx;
  float fVar8;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  iVar2 = (GImGui->GroupStack).Size;
  iVar7 = iVar2 + 1;
  iVar6 = (GImGui->GroupStack).Capacity;
  if (iVar2 < iVar6) {
    __dest = (GImGui->GroupStack).Data;
  }
  else {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiGroupData *)(*GImAllocatorAllocFunc)((long)iVar6 * 0x30,GImAllocatorUserData);
    pIVar4 = (pIVar5->GroupStack).Data;
    if (pIVar4 != (ImGuiGroupData *)0x0) {
      memcpy(__dest,pIVar4,(long)(pIVar5->GroupStack).Size * 0x30);
      pIVar4 = (pIVar5->GroupStack).Data;
      if ((pIVar4 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar5->GroupStack).Data = __dest;
    (pIVar5->GroupStack).Capacity = iVar6;
  }
  (pIVar5->GroupStack).Size = iVar7;
  __dest[iVar2].WindowID = pIVar3->ID;
  __dest[iVar2].BackupCursorPos = (pIVar3->DC).CursorPos;
  __dest[iVar2].BackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
  __dest[iVar2].BackupIndent.x = (pIVar3->DC).Indent.x;
  __dest[iVar2].BackupGroupOffset.x = (pIVar3->DC).GroupOffset.x;
  __dest[iVar2].BackupCurrLineSize = (pIVar3->DC).CurrLineSize;
  __dest[iVar2].BackupCurrLineTextBaseOffset = (pIVar3->DC).CurrLineTextBaseOffset;
  __dest[iVar2].BackupActiveIdIsAlive = pIVar5->ActiveIdIsAlive;
  __dest[iVar2].BackupHoveredIdIsAlive = pIVar5->HoveredId != 0;
  __dest[iVar2].BackupActiveIdPreviousFrameIsAlive = pIVar5->ActiveIdPreviousFrameIsAlive;
  __dest[iVar2].EmitItem = true;
  fVar8 = ((pIVar3->DC).CursorPos.x - (pIVar3->Pos).x) - (pIVar3->DC).ColumnsOffset.x;
  (pIVar3->DC).GroupOffset.x = fVar8;
  (pIVar3->DC).Indent.x = fVar8;
  (pIVar3->DC).CursorMaxPos = (pIVar3->DC).CursorPos;
  (pIVar3->DC).CurrLineSize.x = 0.0;
  (pIVar3->DC).CurrLineSize.y = 0.0;
  if (pIVar5->LogEnabled == true) {
    pIVar5->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}